

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

string * antlr::charName_abi_cxx11_(int ch)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  uint in_ESI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  uint t;
  string *s;
  undefined4 in_stack_fffffffffffffff0;
  string *__s;
  
  if (in_ESI == 0xffffffff) {
    __s = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (unaff_retaddr,(char *)__s,
               (allocator<char> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffff3);
  }
  else {
    std::__cxx11::string::string((string *)in_RDI);
    uVar2 = in_ESI & 0xff;
    iVar3 = isprint(uVar2);
    if (iVar3 == 0) {
      std::__cxx11::string::operator+=((string *)in_RDI,"0x");
      bVar1 = (byte)((int)uVar2 >> 4);
      if ((uint)((int)uVar2 >> 4) < 10) {
        std::__cxx11::string::operator+=((string *)in_RDI,bVar1 | 0x30);
      }
      else {
        std::__cxx11::string::operator+=((string *)in_RDI,bVar1 + 0x37);
      }
      bVar1 = (byte)(uVar2 & 0xf);
      if ((uVar2 & 0xf) < 10) {
        std::__cxx11::string::operator+=((string *)in_RDI,bVar1 | 0x30);
      }
      else {
        std::__cxx11::string::operator+=((string *)in_RDI,bVar1 + 0x37);
      }
    }
    else {
      std::__cxx11::string::append((char *)in_RDI);
      std::__cxx11::string::operator+=((string *)in_RDI,(char)uVar2);
      std::__cxx11::string::append((char *)in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

string charName(int ch)
{
	if (ch == EOF)
		return "EOF";
	else
	{
		ANTLR_USE_NAMESPACE(std)string s;

		// when you think you've seen it all.. an isprint that crashes...
		ch = ch & 0xFF;
#ifdef ANTLR_CCTYPE_NEEDS_STD
		if( ANTLR_USE_NAMESPACE(std)isprint( ch ) )
#else
		if( isprint( ch ) )
#endif
		{
			s.append("'");
			s += ch;
			s.append("'");
//			s += "'"+ch+"'";
		}
		else
		{
			s += "0x";

			unsigned int t = ch >> 4;
			if( t < 10 )
				s += t | 0x30;
			else
				s += t + 0x37;
			t = ch & 0xF;
			if( t < 10 )
				s += t | 0x30;
			else
				s += t + 0x37;
		}
		return s;
	}
}